

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O1

void nni_posix_udp_cb(void *arg,uint events)

{
  nni_list *pnVar1;
  bool bVar2;
  undefined8 uVar3;
  nni_iov *pnVar4;
  nng_err nVar5;
  int iVar6;
  int iVar7;
  nni_aio *pnVar8;
  ulong uVar9;
  ssize_t sVar10;
  nni_sockaddr *pnVar11;
  size_t sVar12;
  int *piVar13;
  uint events_00;
  long lVar14;
  undefined1 local_188 [8];
  sockaddr_storage ss;
  iovec iov [8];
  msghdr local_78;
  nni_iov *local_40;
  nng_iov *aiov;
  uint niov;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x70));
  aiov._0_4_ = events;
  if ((events & 1) != 0) {
    pnVar1 = (nni_list *)((long)arg + 0x40);
    pnVar8 = (nni_aio *)nni_list_first(pnVar1);
    while (pnVar8 != (nni_aio *)0x0) {
      nni_aio_get_iov(pnVar8,(uint *)((long)&aiov + 4),&local_40);
      if (8 < aiov._4_4_) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0x90,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar4 = local_40;
      local_78.msg_control = (void *)0x0;
      local_78.msg_controllen = 0;
      local_78.msg_namelen = 0;
      local_78._12_4_ = 0;
      uVar3 = local_78._8_8_;
      local_78._12_4_ = 0;
      local_78.msg_flags = 0;
      local_78._52_4_ = 0;
      uVar9 = (ulong)aiov._4_4_;
      if (uVar9 != 0) {
        lVar14 = 0;
        local_78._8_8_ = uVar3;
        do {
          *(undefined8 *)(ss.__ss_padding + lVar14 + 0x76) =
               *(undefined8 *)((long)&pnVar4->iov_buf + lVar14);
          *(undefined8 *)((long)&iov[0].iov_base + lVar14) =
               *(undefined8 *)((long)&pnVar4->iov_len + lVar14);
          lVar14 = lVar14 + 0x10;
        } while (uVar9 << 4 != lVar14);
      }
      local_78.msg_iov = (iovec *)&ss.__ss_align;
      local_78.msg_name = local_188;
      local_78.msg_namelen = 0x80;
      local_78.msg_iovlen = uVar9;
      sVar10 = recvmsg(*(int *)((long)arg + 0x38),&local_78,0);
      if ((int)sVar10 < 0) {
        piVar13 = __errno_location();
        if (*piVar13 == 0xb) break;
        nVar5 = nni_plat_errno(*piVar13);
      }
      else {
        nVar5 = NNG_OK;
        pnVar11 = (nni_sockaddr *)nni_aio_get_input(pnVar8,0);
        if (pnVar11 != (nni_sockaddr *)0x0) {
          nni_posix_sockaddr2nn(pnVar11,local_188,local_78._8_8_ & 0xffffffff);
        }
      }
      nni_list_remove(pnVar1,pnVar8);
      nni_aio_finish(pnVar8,nVar5,(long)(int)sVar10);
      pnVar8 = (nni_aio *)nni_list_first(pnVar1);
    }
  }
  if (((uint)aiov & 4) != 0) {
    pnVar1 = (nni_list *)((long)arg + 0x58);
    pnVar8 = (nni_aio *)nni_list_first(pnVar1);
    while (pnVar8 != (nni_aio *)0x0) {
      nni_aio_get_iov(pnVar8,(uint *)((long)&aiov + 4),&local_40);
      if (8 < aiov._4_4_) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0xdd,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar11 = (nni_sockaddr *)nni_aio_get_input(pnVar8,0);
      sVar12 = nni_posix_nn2sockaddr(local_188,pnVar11);
      pnVar4 = local_40;
      if ((int)sVar12 < 1) {
        nVar5 = NNG_EADDRINVAL;
        iVar6 = 0;
      }
      else {
        local_78.msg_control = (void *)0x0;
        local_78.msg_controllen = 0;
        local_78.msg_namelen = 0;
        local_78._12_4_ = 0;
        uVar3 = local_78._8_8_;
        local_78._12_4_ = 0;
        local_78.msg_flags = 0;
        local_78._52_4_ = 0;
        uVar9 = (ulong)aiov._4_4_;
        if (uVar9 != 0) {
          lVar14 = 0;
          local_78._8_8_ = uVar3;
          do {
            *(undefined8 *)(ss.__ss_padding + lVar14 + 0x76) =
                 *(undefined8 *)((long)&pnVar4->iov_buf + lVar14);
            *(undefined8 *)((long)&iov[0].iov_base + lVar14) =
                 *(undefined8 *)((long)&pnVar4->iov_len + lVar14);
            lVar14 = lVar14 + 0x10;
          } while (uVar9 << 4 != lVar14);
        }
        local_78.msg_iov = (iovec *)&ss.__ss_align;
        local_78.msg_name = local_188;
        local_78.msg_namelen = (int)sVar12;
        local_78.msg_iovlen = uVar9;
        sVar10 = sendmsg(*(int *)((long)arg + 0x38),&local_78,0x4000);
        bVar2 = true;
        nVar5 = NNG_OK;
        iVar6 = (int)sVar10;
        if (iVar6 < 0) {
          piVar13 = __errno_location();
          nVar5 = NNG_OK;
          bVar2 = false;
          if (*piVar13 != 0xb) {
            nVar5 = nni_plat_errno(*piVar13);
            bVar2 = true;
          }
        }
        if (!bVar2) break;
      }
      nni_list_remove(pnVar1,pnVar8);
      nni_aio_finish(pnVar8,nVar5,(long)iVar6);
      pnVar8 = (nni_aio *)nni_list_first(pnVar1);
    }
  }
  iVar6 = 7;
  if (((uint)aiov & 0x38) == 0) {
    iVar6 = nni_list_empty((nni_list *)((long)arg + 0x58));
    iVar7 = nni_list_empty((nni_list *)((long)arg + 0x40));
    events_00 = (uint)(iVar7 == 0) | (uint)(iVar6 == 0) << 2;
    if ((events_00 == 0) || (iVar6 = nni_posix_pfd_arm((nni_posix_pfd *)arg,events_00), iVar6 == 0))
    goto LAB_0011d85f;
  }
  nni_posix_udp_doerror((nni_plat_udp *)arg,iVar6);
LAB_0011d85f:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x70));
  return;
}

Assistant:

static void
nni_posix_udp_cb(void *arg, unsigned events)
{
	nni_plat_udp *udp = arg;

	nni_mtx_lock(&udp->udp_mtx);
	if (events & NNI_POLL_IN) {
		nni_posix_udp_dorecv(udp);
	}
	if (events & NNI_POLL_OUT) {
		nni_posix_udp_dosend(udp);
	}
	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		nni_posix_udp_doclose(udp);
	} else {
		events = 0;
		if (!nni_list_empty(&udp->udp_sendq)) {
			events |= NNI_POLL_OUT;
		}
		if (!nni_list_empty(&udp->udp_recvq)) {
			events |= NNI_POLL_IN;
		}
		if (events) {
			int rv;
			rv = nni_posix_pfd_arm(&udp->udp_pfd, events);
			if (rv != 0) {
				nni_posix_udp_doerror(udp, rv);
			}
		}
	}
	nni_mtx_unlock(&udp->udp_mtx);
}